

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_not_has_argument_exception::~option_not_has_argument_exception
          (option_not_has_argument_exception *this)

{
  option_not_has_argument_exception *this_local;
  
  ~option_not_has_argument_exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

option_not_has_argument_exception
    (
      const std::string& option,
      const std::string& arg
    )
    : OptionParseException(
        u8"Option ‘" + option + u8"’ does not take an argument, but argument‘"
        + arg + "’ given")
    {
    }